

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
          (QNetworkReplyHttpImplPrivate *this,qint64 bytesReceived,qint64 bytesTotal)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  QNetworkReplyHttpImplPrivate *in_RDX;
  QNetworkReplyHttpImplPrivate *in_RSI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  int pendingSignals;
  QNetworkReplyHttpImpl *q;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  q_func(in_RDI);
  uVar3 = QIODevice::isOpen();
  if ((uVar3 & 1) != 0) {
    std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x31e37f
              );
    iVar2 = QBasicAtomicInteger<int>::fetchAndAddAcquire
                      ((QBasicAtomicInteger<int> *)in_RDI,in_stack_ffffffffffffffcc);
    iVar2 = iVar2 + -1;
    if ((iVar2 < 1) && (uVar3 = QIODevice::isOpen(), (uVar3 & 1) != 0)) {
      if ((((in_RDI->cacheEnabled & 1U) != 0) &&
          (((bVar1 = isCachingAllowed(in_RDI), bVar1 && (in_RSI == in_RDX)) &&
           (initCacheSaveDevice(in_RSI), in_RDI->cacheSaveDevice != (QIODevice *)0x0)))) &&
         ((in_RDI->cacheEnabled & 1U) != 0)) {
        QIODevice::write((char *)in_RDI->cacheSaveDevice,(longlong)in_RDI->downloadZerocopyBuffer);
      }
      bVar1 = isHttpRedirectResponse(in_RDI);
      if (!bVar1) {
        in_RDI->bytesDownloaded = (qint64)in_RSI;
        setupTransferTimeout(in_RSI);
        in_RDI->downloadBufferCurrentSize = (qint64)in_RSI;
        if (0 < in_RDI->bytesDownloaded) {
          QIODevice::readyRead();
        }
        uVar3 = QElapsedTimer::isValid();
        if (((uVar3 & 1) != 0) && (lVar4 = QElapsedTimer::elapsed(), 99 < lVar4)) {
          QElapsedTimer::start();
          QNetworkReply::downloadProgress
                    ((QNetworkReply *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     CONCAT44(iVar2,in_stack_ffffffffffffffd8),(qint64)in_RDI);
        }
      }
    }
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot(qint64 bytesReceived,  qint64 bytesTotal)
{
    Q_Q(QNetworkReplyHttpImpl);

    // If we're closed just ignore this data
    if (!q->isOpen())
        return;

    // we can be sure here that there is a download buffer

    int pendingSignals = (int)pendingDownloadProgressEmissions->fetchAndAddAcquire(-1) - 1;
    if (pendingSignals > 0) {
        // Let's ignore this signal and look at the next one coming in
        // (signal comppression)
        return;
    }

    if (!q->isOpen())
        return;

    if (cacheEnabled && isCachingAllowed() && bytesReceived == bytesTotal) {
        // Write everything in one go if we use a download buffer. might be more performant.
        initCacheSaveDevice();
        // need to check again if cache enabled and device exists
        if (cacheSaveDevice && cacheEnabled)
            cacheSaveDevice->write(downloadZerocopyBuffer, bytesTotal);
        // FIXME where is it closed?
    }

    if (isHttpRedirectResponse())
        return;

    bytesDownloaded = bytesReceived;
    setupTransferTimeout();

    downloadBufferCurrentSize = bytesReceived;

    // Only emit readyRead when actual data is there
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (bytesDownloaded > 0)
        emit q->readyRead();
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, bytesTotal);
    }
}